

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferTestUtil.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::BufferTestUtil::VertexArrayVerifier::verify
          (VertexArrayVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  GLuint index;
  int y;
  bool bVar1;
  int iVar2;
  int gridSizeX;
  int iVar3;
  int rowLength;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  PixelFormat *this_01;
  reference pointer;
  reference indices_00;
  TestContext *this_02;
  TestLog *log;
  char *imageSetDesc_00;
  undefined8 extraout_RAX;
  int iVar5;
  int iVar6;
  int local_268;
  deUint32 local_22c;
  int local_224;
  int local_1f4;
  PixelBufferAccess local_1f0;
  int local_1c4;
  string local_1c0;
  int local_19c;
  string local_198;
  allocator<char> local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  string imageSetDesc;
  int numRows;
  int numCols;
  int numQuads;
  int curOffset;
  int numBytesToVerify;
  undefined1 local_d0 [3];
  bool isLeftoverBatch;
  int numRemaining;
  Surface reference;
  undefined1 local_a8 [8];
  Surface rendered;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  RGBA local_58;
  RGBA RStack_54;
  bool isOk;
  RGBA local_50;
  deUint32 local_4c;
  RGBA threshold;
  deUint32 program;
  int numVerified;
  int maxQuadsPerBatch;
  int maxQuadsY;
  int maxQuadsX;
  int numBytesInQuad;
  int numBytesInVtx;
  RenderTarget *renderTarget;
  int numBytes_local;
  int offset_local;
  deUint8 *refPtr_local;
  deUint32 buffer_local;
  VertexArrayVerifier *this_local;
  RenderTarget *this_00;
  
  iVar5 = (int)siglen;
  iVar6 = (int)tbs;
  pRVar4 = gles2::Context::getRenderContext((this->super_BufferVerifierBase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[4])();
  this_00 = (RenderTarget *)CONCAT44(extraout_var,iVar2);
  iVar2 = tcu::RenderTarget::getWidth(this_00);
  if (iVar2 < 0) {
    iVar2 = iVar2 + 7;
  }
  gridSizeX = de::min<int>(0x80,iVar2 >> 3);
  iVar2 = tcu::RenderTarget::getHeight(this_00);
  if (iVar2 < 0) {
    iVar2 = iVar2 + 7;
  }
  iVar2 = de::min<int>(0x80,iVar2 >> 3);
  threshold.m_value = 0;
  local_4c = glu::ShaderProgram::getProgram(this->m_program);
  this_01 = tcu::RenderTarget::getPixelFormat(this_00);
  RStack_54 = tcu::PixelFormat::getColorThreshold(this_01);
  tcu::RGBA::RGBA(&local_58,4,4,4,4);
  local_50 = tcu::operator+(&stack0xffffffffffffffac,&local_58);
  positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&rendered.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)local_a8);
  tcu::Surface::Surface((Surface *)local_d0);
  computePositions((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                   &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,gridSizeX,iVar2);
  computeIndices((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&rendered.m_pixels.m_cap
                 ,gridSizeX,iVar2);
  glu::CallLogWrapper::glBindBuffer(&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8893,0)
  ;
  glu::CallLogWrapper::glBindBuffer(&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8892,0)
  ;
  glu::CallLogWrapper::glViewport
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,0,0,gridSizeX << 3,iVar2 << 3);
  glu::CallLogWrapper::glClearColor
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,0.0,0.0,0.0,1.0);
  glu::CallLogWrapper::glUseProgram(&(this->super_BufferVerifierBase).super_CallLogWrapper,local_4c)
  ;
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,this->m_posLoc);
  index = this->m_posLoc;
  pointer = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                      ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                       &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  glu::CallLogWrapper::glVertexAttribPointer
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,index,2,0x1406,'\0',0,pointer);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,this->m_byteVecLoc);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8892,(GLuint)ctx);
  do {
    if (iVar6 <= (int)threshold.m_value) break;
    iVar3 = iVar6 - threshold.m_value;
    if (0xb < iVar3) {
      local_268 = de::min<int>(gridSizeX * iVar2 * 0xc,
                               (((uint)(iVar3 / 6 + (iVar3 >> 0x1f)) >> 1) - (iVar3 >> 0x1f)) * 0xc)
      ;
      local_22c = threshold.m_value;
    }
    else {
      local_224 = 0xc;
      local_22c = iVar6 - 0xc;
      local_268 = local_224;
    }
    y = local_268 / 0xc;
    rowLength = de::min<int>(gridSizeX,y);
    imageSetDesc.field_2._12_4_ = (y / gridSizeX + 1) - (uint)(y % gridSizeX == 0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"Bytes ",&local_171);
    local_19c = iVar5 + local_22c;
    de::toString<int>(&local_198,&local_19c);
    std::operator+(&local_150,&local_170,&local_198);
    std::operator+(&local_130,&local_150," to ");
    local_1c4 = local_268 + -1 + iVar5 + local_22c;
    de::toString<int>(&local_1c0,&local_1c4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                   &local_130,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    glu::CallLogWrapper::glClear(&(this->super_BufferVerifierBase).super_CallLogWrapper,0x4000);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,this->m_byteVecLoc,3,0x1401,
               '\x01',0,(void *)(long)(int)(iVar5 + local_22c));
    indices_00 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            &rendered.m_pixels.m_cap,0);
    glu::CallLogWrapper::glDrawElements
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,4,y * 6,0x1403,indices_00);
    renderQuadGridReference
              ((Surface *)local_d0,y,rowLength,sig + (long)(int)local_22c + (long)iVar5);
    tcu::Surface::setSize((Surface *)local_a8,rowLength << 3,imageSetDesc.field_2._12_4_ << 3);
    pRVar4 = gles2::Context::getRenderContext((this->super_BufferVerifierBase).m_context);
    tcu::Surface::getAccess(&local_1f0,(Surface *)local_a8);
    glu::readPixels(pRVar4,0,0,&local_1f0);
    this_02 = gles2::Context::getTestContext((this->super_BufferVerifierBase).m_context);
    log = tcu::TestContext::getLog(this_02);
    imageSetDesc_00 = (char *)std::__cxx11::string::c_str();
    bVar1 = tcu::pixelThresholdCompare
                      (log,"RenderResult",imageSetDesc_00,(Surface *)local_d0,(Surface *)local_a8,
                       &local_50,COMPARE_LOG_RESULT);
    if (bVar1) {
      if (0xb >= iVar3) {
        local_268 = iVar3;
      }
      threshold.m_value = local_268 + threshold.m_value;
      local_1f4 = 0;
    }
    else {
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      local_1f4 = 3;
    }
    std::__cxx11::string::~string((string *)local_110);
  } while (local_1f4 == 0);
  glu::CallLogWrapper::glDisableVertexAttribArray
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,this->m_posLoc);
  glu::CallLogWrapper::glDisableVertexAttribArray
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,this->m_byteVecLoc);
  tcu::Surface::~Surface((Surface *)local_d0);
  tcu::Surface::~Surface((Surface *)local_a8);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&rendered.m_pixels.m_cap);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),
                       positions.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_);
}

Assistant:

bool VertexArrayVerifier::verify (deUint32 buffer, const deUint8* refPtr, int offset, int numBytes)
{
	const tcu::RenderTarget&	renderTarget		= m_context.getRenderContext().getRenderTarget();
	const int					numBytesInVtx		= 3;
	const int					numBytesInQuad		= numBytesInVtx*4;
	int							maxQuadsX			= de::min(128, renderTarget.getWidth()	/ VERIFY_QUAD_SIZE);
	int							maxQuadsY			= de::min(128, renderTarget.getHeight()	/ VERIFY_QUAD_SIZE);
	int							maxQuadsPerBatch	= maxQuadsX*maxQuadsY;
	int							numVerified			= 0;
	deUint32					program				= m_program->getProgram();
	tcu::RGBA					threshold			= renderTarget.getPixelFormat().getColorThreshold() + tcu::RGBA(4,4,4,4);
	bool						isOk				= true;

	vector<tcu::Vec2>			positions;
	vector<deUint16>			indices;

	tcu::Surface				rendered;
	tcu::Surface				reference;

	DE_ASSERT(numBytes >= numBytesInQuad); // Can't render full quad with smaller buffers.

	computePositions(positions, maxQuadsX, maxQuadsY);
	computeIndices(indices, maxQuadsX, maxQuadsY);

	// Reset buffer bindings.
	glBindBuffer				(GL_ELEMENT_ARRAY_BUFFER,	0);
	glBindBuffer				(GL_ARRAY_BUFFER,			0);

	// Setup rendering state.
	glViewport					(0, 0, maxQuadsX*VERIFY_QUAD_SIZE, maxQuadsY*VERIFY_QUAD_SIZE);
	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glUseProgram				(program);
	glEnableVertexAttribArray	(m_posLoc);
	glVertexAttribPointer		(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, &positions[0]);
	glEnableVertexAttribArray	(m_byteVecLoc);
	glBindBuffer				(GL_ARRAY_BUFFER, buffer);

	while (numVerified < numBytes)
	{
		int		numRemaining		= numBytes-numVerified;
		bool	isLeftoverBatch		= numRemaining < numBytesInQuad;
		int		numBytesToVerify	= isLeftoverBatch ? numBytesInQuad				: de::min(maxQuadsPerBatch*numBytesInQuad, numRemaining - numRemaining%numBytesInQuad);
		int		curOffset			= isLeftoverBatch ? (numBytes-numBytesInQuad)	: numVerified;
		int		numQuads			= numBytesToVerify/numBytesInQuad;
		int		numCols				= de::min(maxQuadsX, numQuads);
		int		numRows				= numQuads/maxQuadsX + (numQuads%maxQuadsX != 0 ? 1 : 0);
		string	imageSetDesc		= string("Bytes ") + de::toString(offset+curOffset) + " to " + de::toString(offset+curOffset+numBytesToVerify-1);

		DE_ASSERT(numBytesToVerify > 0 && numBytesToVerify%numBytesInQuad == 0);
		DE_ASSERT(de::inBounds(curOffset, 0, numBytes));
		DE_ASSERT(de::inRange(curOffset+numBytesToVerify, curOffset, numBytes));

		// Render batch.
		glClear					(GL_COLOR_BUFFER_BIT);
		glVertexAttribPointer	(m_byteVecLoc, 3, GL_UNSIGNED_BYTE, GL_TRUE, 0, (const glw::GLvoid*)(deUintptr)(offset + curOffset));
		glDrawElements			(GL_TRIANGLES, numQuads*6, GL_UNSIGNED_SHORT, &indices[0]);

		renderQuadGridReference(reference,  numQuads, numCols, refPtr + offset + curOffset);

		rendered.setSize(numCols*VERIFY_QUAD_SIZE, numRows*VERIFY_QUAD_SIZE);
		glu::readPixels(m_context.getRenderContext(), 0, 0, rendered.getAccess());

		if (!tcu::pixelThresholdCompare(m_context.getTestContext().getLog(), "RenderResult", imageSetDesc.c_str(), reference, rendered, threshold, tcu::COMPARE_LOG_RESULT))
		{
			isOk = false;
			break;
		}

		numVerified += isLeftoverBatch ? numRemaining : numBytesToVerify;
	}

	glDisableVertexAttribArray	(m_posLoc);
	glDisableVertexAttribArray	(m_byteVecLoc);

	return isOk;
}